

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct16_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  __m256i alVar4;
  __m256i alVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar17 = (long)bit * 0x100;
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar17 + 0x200);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar17 + 0x1a0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar17 + 0x220);
  iVar19 = -iVar2;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar17 + 0x1f0);
  iVar18 = -iVar3;
  iVar14 = 1 << ((char)bit - 1U & 0x1f);
  iVar13 = -*(int *)((long)vert_filter_length_chroma + lVar17 + 0x230);
  iVar20 = bd + (uint)(do_cols == 0) * 2;
  iVar16 = 0x8000;
  if (0xf < iVar20 + 6) {
    iVar16 = 1 << ((char)iVar20 + 5U & 0x1f);
  }
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 0x250);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar37._16_4_ = uVar1;
  auVar37._20_4_ = uVar1;
  auVar37._24_4_ = uVar1;
  auVar37._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 0x1d0);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 0x210);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar32._16_4_ = uVar1;
  auVar32._20_4_ = uVar1;
  auVar32._24_4_ = uVar1;
  auVar32._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 0x1b0);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 400);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar36._16_4_ = uVar1;
  auVar36._20_4_ = uVar1;
  auVar36._24_4_ = uVar1;
  auVar36._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 0x170);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 0x240);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 0x1c0);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  auVar28._4_4_ = iVar15;
  auVar28._0_4_ = iVar15;
  auVar28._8_4_ = iVar15;
  auVar28._12_4_ = iVar15;
  auVar28._16_4_ = iVar15;
  auVar28._20_4_ = iVar15;
  auVar28._24_4_ = iVar15;
  auVar28._28_4_ = iVar15;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 0x180);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  auVar23._4_4_ = iVar12;
  auVar23._0_4_ = iVar12;
  auVar23._8_4_ = iVar12;
  auVar23._12_4_ = iVar12;
  auVar23._16_4_ = iVar12;
  auVar23._20_4_ = iVar12;
  auVar23._24_4_ = iVar12;
  auVar23._28_4_ = iVar12;
  auVar38._4_4_ = iVar13;
  auVar38._0_4_ = iVar13;
  auVar38._8_4_ = iVar13;
  auVar38._12_4_ = iVar13;
  auVar38._16_4_ = iVar13;
  auVar38._20_4_ = iVar13;
  auVar38._24_4_ = iVar13;
  auVar38._28_4_ = iVar13;
  auVar22._4_4_ = iVar14;
  auVar22._0_4_ = iVar14;
  auVar22._8_4_ = iVar14;
  auVar22._12_4_ = iVar14;
  auVar22._16_4_ = iVar14;
  auVar22._20_4_ = iVar14;
  auVar22._24_4_ = iVar14;
  auVar22._28_4_ = iVar14;
  auVar21 = vpmulld_avx2((undefined1  [32])in[1],auVar21);
  auVar37 = vpmulld_avx2((undefined1  [32])in[1],auVar37);
  auVar23 = vpmulld_avx2((undefined1  [32])in[7],auVar23);
  auVar39 = vpmulld_avx2((undefined1  [32])in[7],auVar39);
  auVar21 = vpaddd_avx2(auVar21,auVar22);
  auVar6 = vpsrad_avx2(auVar21,ZEXT416((uint)bit));
  auVar21 = vpaddd_avx2(auVar37,auVar22);
  auVar7 = vpsrad_avx2(auVar21,ZEXT416((uint)bit));
  auVar37 = vpmulld_avx2((undefined1  [32])in[5],auVar40);
  auVar32 = vpmulld_avx2((undefined1  [32])in[5],auVar32);
  auVar21 = vpaddd_avx2(auVar23,auVar22);
  auVar41 = ZEXT416((uint)bit);
  auVar40 = vpsrad_avx2(auVar21,auVar41);
  auVar21 = vpaddd_avx2(auVar39,auVar22);
  auVar8 = vpsrad_avx2(auVar21,auVar41);
  auVar21 = vpaddd_avx2(auVar37,auVar22);
  auVar39 = vpsrad_avx2(auVar21,auVar41);
  auVar37 = vpmulld_avx2((undefined1  [32])in[3],auVar38);
  auVar23 = vpmulld_avx2((undefined1  [32])in[3],auVar36);
  auVar21 = vpaddd_avx2(auVar32,auVar22);
  auVar32 = vpsrad_avx2(auVar21,auVar41);
  auVar21 = vpaddd_avx2(auVar37,auVar22);
  auVar41 = ZEXT416((uint)bit);
  auVar27 = vpsrad_avx2(auVar21,auVar41);
  auVar21 = vpaddd_avx2(auVar23,auVar22);
  auVar36 = vpsrad_avx2(auVar21,auVar41);
  auVar21 = vpmulld_avx2((undefined1  [32])in[2],auVar34);
  auVar37 = vpmulld_avx2((undefined1  [32])in[2],auVar30);
  auVar21 = vpaddd_avx2(auVar21,auVar22);
  auVar30 = vpsrad_avx2(auVar21,auVar41);
  auVar21 = vpaddd_avx2(auVar37,auVar22);
  auVar34 = vpsrad_avx2(auVar21,auVar41);
  auVar21 = vpmulld_avx2((undefined1  [32])in[6],auVar28);
  auVar21 = vpaddd_avx2(auVar21,auVar22);
  auVar28 = vpsrad_avx2(auVar21,auVar41);
  auVar21 = vpmulld_avx2((undefined1  [32])in[6],auVar26);
  auVar21 = vpaddd_avx2(auVar21,auVar22);
  auVar26 = vpsrad_avx2(auVar21,auVar41);
  auVar21 = vpaddd_avx2(auVar40,auVar7);
  auVar7 = vpsubd_avx2(auVar7,auVar40);
  auVar37 = vpaddd_avx2(auVar32,auVar27);
  auVar38 = vpsubd_avx2(auVar27,auVar32);
  auVar23 = vpaddd_avx2(auVar39,auVar36);
  auVar9 = vpsubd_avx2(auVar36,auVar39);
  auVar39 = vpaddd_avx2(auVar8,auVar6);
  auVar8 = vpsubd_avx2(auVar6,auVar8);
  auVar32 = vpaddd_avx2(auVar28,auVar34);
  auVar10 = vpsubd_avx2(auVar34,auVar28);
  auVar6 = vpaddd_avx2(auVar26,auVar30);
  auVar11 = vpsubd_avx2(auVar30,auVar26);
  iVar15 = -iVar16;
  iVar16 = iVar16 + -1;
  auVar29._4_4_ = iVar3;
  auVar29._0_4_ = iVar3;
  auVar29._8_4_ = iVar3;
  auVar29._12_4_ = iVar3;
  auVar29._16_4_ = iVar3;
  auVar29._20_4_ = iVar3;
  auVar29._24_4_ = iVar3;
  auVar29._28_4_ = iVar3;
  auVar33._4_4_ = iVar19;
  auVar33._0_4_ = iVar19;
  auVar33._8_4_ = iVar19;
  auVar33._12_4_ = iVar19;
  auVar33._16_4_ = iVar19;
  auVar33._20_4_ = iVar19;
  auVar33._24_4_ = iVar19;
  auVar33._28_4_ = iVar19;
  auVar24._4_4_ = iVar15;
  auVar24._0_4_ = iVar15;
  auVar24._8_4_ = iVar15;
  auVar24._12_4_ = iVar15;
  auVar24._16_4_ = iVar15;
  auVar24._20_4_ = iVar15;
  auVar24._24_4_ = iVar15;
  auVar24._28_4_ = iVar15;
  auVar25._4_4_ = iVar16;
  auVar25._0_4_ = iVar16;
  auVar25._8_4_ = iVar16;
  auVar25._12_4_ = iVar16;
  auVar25._16_4_ = iVar16;
  auVar25._20_4_ = iVar16;
  auVar25._24_4_ = iVar16;
  auVar25._28_4_ = iVar16;
  auVar7 = vpmaxsd_avx2(auVar7,auVar24);
  auVar40 = vpminsd_avx2(auVar7,auVar25);
  auVar7 = vpmaxsd_avx2(auVar8,auVar24);
  auVar8 = vpminsd_avx2(auVar7,auVar25);
  auVar7 = vpmulld_avx2(auVar8,auVar29);
  auVar7 = vpaddd_avx2(auVar7,auVar22);
  auVar27 = vpmulld_avx2(auVar40,auVar33);
  auVar7 = vpaddd_avx2(auVar27,auVar7);
  auVar31._4_4_ = iVar2;
  auVar31._0_4_ = iVar2;
  auVar31._8_4_ = iVar2;
  auVar31._12_4_ = iVar2;
  auVar31._16_4_ = iVar2;
  auVar31._20_4_ = iVar2;
  auVar31._24_4_ = iVar2;
  auVar31._28_4_ = iVar2;
  auVar27 = vpmulld_avx2(auVar40,auVar29);
  auVar40 = vpmulld_avx2(auVar8,auVar31);
  auVar40 = vpaddd_avx2(auVar40,auVar22);
  auVar40 = vpaddd_avx2(auVar40,auVar27);
  auVar27._4_4_ = iVar18;
  auVar27._0_4_ = iVar18;
  auVar27._8_4_ = iVar18;
  auVar27._12_4_ = iVar18;
  auVar27._16_4_ = iVar18;
  auVar27._20_4_ = iVar18;
  auVar27._24_4_ = iVar18;
  auVar27._28_4_ = iVar18;
  auVar8 = vpmaxsd_avx2(auVar38,auVar24);
  auVar36 = vpminsd_avx2(auVar8,auVar25);
  auVar8 = vpmaxsd_avx2(auVar9,auVar24);
  auVar30 = vpminsd_avx2(auVar8,auVar25);
  auVar27 = vpmulld_avx2(auVar36,auVar27);
  auVar8 = vpmulld_avx2(auVar30,auVar33);
  auVar8 = vpaddd_avx2(auVar8,auVar22);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar17 + 0x1e0);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  auVar34 = vpmulld_avx2(auVar35,(undefined1  [32])*in);
  auVar8 = vpaddd_avx2(auVar8,auVar27);
  auVar27 = vpaddd_avx2(auVar34,auVar22);
  auVar28 = vpsrad_avx2(auVar27,auVar41);
  auVar36 = vpmulld_avx2(auVar36,auVar33);
  auVar27 = vpmulld_avx2((undefined1  [32])in[4],auVar31);
  auVar34 = vpmulld_avx2((undefined1  [32])in[4],auVar29);
  auVar30 = vpmulld_avx2(auVar30,auVar29);
  auVar27 = vpaddd_avx2(auVar27,auVar22);
  auVar26 = vpsrad_avx2(auVar27,auVar41);
  auVar27 = vpaddd_avx2(auVar34,auVar22);
  auVar41 = ZEXT416((uint)bit);
  auVar34 = vpsrad_avx2(auVar27,auVar41);
  auVar27 = vpaddd_avx2(auVar22,auVar30);
  auVar27 = vpaddd_avx2(auVar36,auVar27);
  auVar36 = vpaddd_avx2(auVar26,auVar28);
  auVar38 = vpsubd_avx2(auVar28,auVar26);
  auVar30 = vpaddd_avx2(auVar34,auVar28);
  auVar9 = vpsubd_avx2(auVar28,auVar34);
  auVar34 = vpmaxsd_avx2(auVar24,auVar10);
  auVar28 = vpminsd_avx2(auVar34,auVar25);
  auVar34 = vpmaxsd_avx2(auVar11,auVar24);
  auVar34 = vpminsd_avx2(auVar34,auVar25);
  auVar26 = vpmulld_avx2(auVar28,auVar35);
  auVar28 = vpmulld_avx2(auVar34,auVar35);
  auVar34 = vpsubd_avx2(auVar22,auVar26);
  auVar34 = vpaddd_avx2(auVar34,auVar28);
  auVar28 = vpaddd_avx2(auVar22,auVar28);
  auVar28 = vpaddd_avx2(auVar26,auVar28);
  auVar21 = vpmaxsd_avx2(auVar24,auVar21);
  auVar26 = vpminsd_avx2(auVar21,auVar25);
  auVar21 = vpmaxsd_avx2(auVar24,auVar37);
  auVar7 = vpsrad_avx2(auVar7,auVar41);
  auVar37 = vpminsd_avx2(auVar21,auVar25);
  auVar8 = vpsrad_avx2(auVar8,auVar41);
  auVar21 = vpaddd_avx2(auVar37,auVar26);
  auVar26 = vpsubd_avx2(auVar26,auVar37);
  auVar37 = vpaddd_avx2(auVar8,auVar7);
  auVar10 = vpsubd_avx2(auVar7,auVar8);
  auVar23 = vpmaxsd_avx2(auVar24,auVar23);
  auVar7 = vpminsd_avx2(auVar23,auVar25);
  auVar23 = vpmaxsd_avx2(auVar24,auVar39);
  auVar40 = vpsrad_avx2(auVar40,auVar41);
  auVar39 = vpminsd_avx2(auVar23,auVar25);
  auVar8 = vpsrad_avx2(auVar27,auVar41);
  auVar23 = vpaddd_avx2(auVar7,auVar39);
  auVar11 = vpsubd_avx2(auVar39,auVar7);
  auVar39 = vpaddd_avx2(auVar8,auVar40);
  auVar29 = vpsubd_avx2(auVar40,auVar8);
  auVar6 = vpmaxsd_avx2(auVar24,auVar6);
  auVar7 = vpminsd_avx2(auVar6,auVar25);
  auVar6 = vpmaxsd_avx2(auVar36,auVar24);
  auVar40 = vpminsd_avx2(auVar6,auVar25);
  auVar6 = vpaddd_avx2(auVar40,auVar7);
  auVar31 = vpsubd_avx2(auVar40,auVar7);
  auVar7 = vpmaxsd_avx2(auVar30,auVar24);
  auVar8 = vpsrad_avx2(auVar28,auVar41);
  auVar40 = vpminsd_avx2(auVar7,auVar25);
  auVar7 = vpaddd_avx2(auVar8,auVar40);
  auVar33 = vpsubd_avx2(auVar40,auVar8);
  auVar40 = vpmaxsd_avx2(auVar24,auVar9);
  auVar8 = vpminsd_avx2(auVar40,auVar25);
  auVar27 = vpsrad_avx2(auVar34,auVar41);
  auVar40 = vpaddd_avx2(auVar27,auVar8);
  auVar9 = vpsubd_avx2(auVar8,auVar27);
  auVar32 = vpmaxsd_avx2(auVar24,auVar32);
  auVar8 = vpminsd_avx2(auVar32,auVar25);
  auVar32 = vpmaxsd_avx2(auVar24,auVar38);
  auVar27 = vpminsd_avx2(auVar32,auVar25);
  auVar32 = vpaddd_avx2(auVar27,auVar8);
  auVar38 = vpsubd_avx2(auVar27,auVar8);
  auVar8 = vpmaxsd_avx2(auVar10,auVar24);
  auVar27 = vpminsd_avx2(auVar8,auVar25);
  auVar8 = vpmaxsd_avx2(auVar29,auVar24);
  auVar8 = vpminsd_avx2(auVar8,auVar25);
  auVar27 = vpmulld_avx2(auVar27,auVar35);
  auVar36 = vpmulld_avx2(auVar8,auVar35);
  auVar8 = vpsubd_avx2(auVar22,auVar27);
  auVar8 = vpaddd_avx2(auVar8,auVar36);
  auVar27 = vpaddd_avx2(auVar27,auVar22);
  auVar27 = vpaddd_avx2(auVar27,auVar36);
  auVar36 = vpmaxsd_avx2(auVar26,auVar24);
  auVar30 = vpminsd_avx2(auVar36,auVar25);
  auVar36 = vpmaxsd_avx2(auVar11,auVar24);
  auVar36 = vpminsd_avx2(auVar36,auVar25);
  auVar34 = vpmulld_avx2(auVar30,auVar35);
  auVar30 = vpmulld_avx2(auVar36,auVar35);
  auVar36 = vpsubd_avx2(auVar22,auVar34);
  auVar36 = vpaddd_avx2(auVar36,auVar30);
  auVar30 = vpaddd_avx2(auVar22,auVar30);
  auVar28 = vpsrad_avx2(auVar8,auVar41);
  auVar27 = vpsrad_avx2(auVar27,auVar41);
  auVar36 = vpsrad_avx2(auVar36,auVar41);
  auVar8 = vpaddd_avx2(auVar34,auVar30);
  auVar30 = vpsrad_avx2(auVar8,auVar41);
  auVar23 = vpmaxsd_avx2(auVar23,auVar24);
  auVar8 = vpminsd_avx2(auVar23,auVar25);
  auVar23 = vpmaxsd_avx2(auVar6,auVar24);
  auVar6 = vpminsd_avx2(auVar23,auVar25);
  auVar23 = vpaddd_avx2(auVar8,auVar6);
  auVar6 = vpsubd_avx2(auVar6,auVar8);
  auVar23 = vpmaxsd_avx2(auVar23,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  *out = alVar4;
  auVar23 = vpmaxsd_avx2(auVar6,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[0xf] = alVar4;
  auVar23 = vpmaxsd_avx2(auVar24,auVar39);
  auVar39 = vpminsd_avx2(auVar23,auVar25);
  auVar23 = vpmaxsd_avx2(auVar7,auVar24);
  auVar6 = vpminsd_avx2(auVar23,auVar25);
  auVar23 = vpaddd_avx2(auVar6,auVar39);
  auVar6 = vpsubd_avx2(auVar6,auVar39);
  auVar23 = vpmaxsd_avx2(auVar23,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[1] = alVar4;
  auVar23 = vpmaxsd_avx2(auVar40,auVar24);
  auVar39 = vpminsd_avx2(auVar23,auVar25);
  auVar23 = vpmaxsd_avx2(auVar6,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[0xe] = alVar4;
  auVar23 = vpaddd_avx2(auVar27,auVar39);
  auVar6 = vpsubd_avx2(auVar39,auVar27);
  auVar23 = vpmaxsd_avx2(auVar23,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[2] = alVar4;
  auVar23 = vpmaxsd_avx2(auVar32,auVar24);
  auVar39 = vpminsd_avx2(auVar23,auVar25);
  auVar23 = vpmaxsd_avx2(auVar6,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[0xd] = alVar4;
  auVar23 = vpaddd_avx2(auVar30,auVar39);
  auVar32 = vpsubd_avx2(auVar39,auVar30);
  auVar23 = vpmaxsd_avx2(auVar23,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[3] = alVar4;
  auVar23 = vpmaxsd_avx2(auVar24,auVar38);
  auVar39 = vpminsd_avx2(auVar23,auVar25);
  auVar23 = vpmaxsd_avx2(auVar32,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[0xc] = alVar4;
  auVar23 = vpaddd_avx2(auVar36,auVar39);
  auVar32 = vpsubd_avx2(auVar39,auVar36);
  auVar23 = vpmaxsd_avx2(auVar23,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[4] = alVar4;
  auVar23 = vpmaxsd_avx2(auVar24,auVar9);
  auVar39 = vpminsd_avx2(auVar23,auVar25);
  auVar23 = vpmaxsd_avx2(auVar32,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[0xb] = alVar4;
  auVar23 = vpaddd_avx2(auVar39,auVar28);
  auVar32 = vpsubd_avx2(auVar39,auVar28);
  auVar23 = vpmaxsd_avx2(auVar23,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar25);
  out[5] = alVar4;
  auVar37 = vpmaxsd_avx2(auVar24,auVar37);
  auVar23 = vpminsd_avx2(auVar37,auVar25);
  auVar37 = vpmaxsd_avx2(auVar24,auVar33);
  auVar39 = vpminsd_avx2(auVar37,auVar25);
  auVar37 = vpmaxsd_avx2(auVar32,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar37,auVar25);
  out[10] = alVar4;
  auVar37 = vpaddd_avx2(auVar39,auVar23);
  auVar39 = vpsubd_avx2(auVar39,auVar23);
  auVar37 = vpmaxsd_avx2(auVar37,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar37,auVar25);
  out[6] = alVar4;
  auVar21 = vpmaxsd_avx2(auVar24,auVar21);
  auVar37 = vpminsd_avx2(auVar21,auVar25);
  auVar21 = vpmaxsd_avx2(auVar24,auVar31);
  auVar23 = vpminsd_avx2(auVar21,auVar25);
  auVar21 = vpmaxsd_avx2(auVar39,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar21,auVar25);
  out[9] = alVar4;
  auVar21 = vpaddd_avx2(auVar23,auVar37);
  auVar37 = vpsubd_avx2(auVar23,auVar37);
  auVar21 = vpmaxsd_avx2(auVar21,auVar24);
  auVar37 = vpmaxsd_avx2(auVar37,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar21,auVar25);
  alVar5 = (__m256i)vpminsd_avx2(auVar37,auVar25);
  out[7] = alVar4;
  out[8] = alVar5;
  if (do_cols == 0) {
    iVar2 = 10;
    if (10 < bd) {
      iVar2 = bd;
    }
    local_a0 = 0x20 << ((byte)iVar2 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    round_shift_8x8_avx2(out,out_shift);
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_80,(__m256i *)&local_a0,0x10);
  }
  return;
}

Assistant:

static void idct16_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[0];
  x1[2] = input[4];
  x1[4] = input[2];
  x1[6] = input[6];
  x1[8] = input[1];
  x1[10] = input[5];
  x1[12] = input[3];
  x1[14] = input[7];

  // stage 2
  btf_16_w16_0_avx2(cospi[60], cospi[4], x1[8], x1[8], x1[15]);
  btf_16_w16_0_avx2(-cospi[36], cospi[28], x1[14], x1[9], x1[14]);
  btf_16_w16_0_avx2(cospi[44], cospi[20], x1[10], x1[10], x1[13]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x1[12], x1[11], x1[12]);

  // stage 3
  btf_16_w16_0_avx2(cospi[56], cospi[8], x1[4], x1[4], x1[7]);
  btf_16_w16_0_avx2(-cospi[40], cospi[24], x1[6], x1[5], x1[6]);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);

  // stage 4
  btf_16_w16_0_avx2(cospi[32], cospi[32], x1[0], x1[0], x1[1]);
  btf_16_w16_0_avx2(cospi[48], cospi[16], x1[2], x1[2], x1[3]);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r,
                  INV_COS_BIT);

  idct16_stage5_avx2(x1, cospi, _r, INV_COS_BIT);
  idct16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  idct16_stage7_avx2(output, x1);
}